

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

TypeAliasType * __thiscall
slang::BumpAllocator::
emplace<slang::ast::TypeAliasType,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&>
          (BumpAllocator *this,basic_string_view<char,_std::char_traits<char>_> *args,
          SourceLocation *args_1)

{
  string_view name;
  TypeAliasType *this_00;
  
  this_00 = (TypeAliasType *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((TypeAliasType *)this->endPtr < this_00 + 1) {
    this_00 = (TypeAliasType *)allocateSlow(this,0x98,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  name._M_len = args->_M_len;
  name._M_str = args->_M_str;
  ast::TypeAliasType::TypeAliasType(this_00,name,*args_1);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }